

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

FArrayBox * amrex::VisMF::readFAB(int idx,string *mf_name,Header *hdr,int whichComp)

{
  bool bVar1;
  int iVar2;
  BaseFab<double> *pBVar3;
  FabOnDisk *pFVar4;
  ifstream *piVar5;
  double *out;
  Long LVar6;
  istream *is;
  RealDescriptor *pRVar7;
  int in_ECX;
  int *in_RDX;
  Long readDataItems_1;
  Long bytesPerComp;
  Long readDataItems;
  Real *fabdata;
  ifstream *infs;
  string FullName;
  FArrayBox *fab;
  Box fab_box;
  int r;
  Arena *in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed2;
  undefined4 in_stack_fffffffffffffed3;
  undefined1 in_stack_fffffffffffffed7;
  RealDescriptor *in_stack_fffffffffffffed8;
  undefined1 forceClose;
  BoxArray *in_stack_fffffffffffffee0;
  BaseFab<double> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string *in_stack_ffffffffffffff20;
  string *filename;
  int local_b0;
  int local_ac;
  RealDescriptor *in_stack_ffffffffffffff60;
  istream *in_stack_ffffffffffffff68;
  Long in_stack_ffffffffffffff70;
  string local_78;
  BaseFab<double> *local_48;
  Box local_40;
  int local_24;
  int *local_20;
  int local_c;
  int *local_8;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  BoxArray::operator[](in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  local_8 = local_20 + 3;
  if (local_20[4] < *local_8) {
    local_ac = *local_8;
  }
  else {
    local_ac = local_20[4];
  }
  local_c = local_ac;
  if (local_20[5] < local_ac) {
    local_b0 = local_ac;
  }
  else {
    local_b0 = local_20[5];
  }
  if (0 < local_b0) {
    Box::grow(&local_40,(IntVect *)(local_20 + 3));
  }
  pBVar3 = (BaseFab<double> *)operator_new(0x48);
  FArrayBox::FArrayBox
            ((FArrayBox *)in_stack_fffffffffffffee0,(Box *)in_stack_fffffffffffffed8,
             CONCAT13(in_stack_fffffffffffffed7,(int3)((uint)in_stack_fffffffffffffed3 >> 8)),
             SUB41(in_stack_fffffffffffffed3,0),(bool)in_stack_fffffffffffffed2,
             in_stack_fffffffffffffec8);
  filename = &local_78;
  local_48 = pBVar3;
  DirName(filename);
  pFVar4 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::operator[]
                     ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)
                      CONCAT17(in_stack_fffffffffffffed7,
                               CONCAT43(in_stack_fffffffffffffed3,
                                        CONCAT12(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0
                                                ))),(size_type)in_stack_fffffffffffffec8);
  std::__cxx11::string::operator+=((string *)filename,(string *)pFVar4);
  piVar5 = OpenStream(in_stack_ffffffffffffff20);
  pFVar4 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::operator[]
                     ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_> *)
                      CONCAT17(in_stack_fffffffffffffed7,
                               CONCAT43(in_stack_fffffffffffffed3,
                                        CONCAT12(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0
                                                ))),(size_type)in_stack_fffffffffffffec8);
  std::istream::seekg((long)piVar5,(_Ios_Seekdir)pFVar4->m_head);
  iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  if (*local_20 == 1) {
    if (local_24 == -1) {
      FArrayBox::readFrom((FArrayBox *)in_stack_fffffffffffffee0,
                          (istream *)in_stack_fffffffffffffed8);
      forceClose = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    }
    else {
      FArrayBox::readFrom((FArrayBox *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                          ,(istream *)in_stack_fffffffffffffee8,iVar2);
      forceClose = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    }
  }
  else {
    out = BaseFab<double>::dataPtr(in_stack_fffffffffffffee8,iVar2);
    if (local_24 == -1) {
      FPC::NativeRealDescriptor();
      bVar1 = RealDescriptor::operator==
                        ((RealDescriptor *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      forceClose = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      if (bVar1) {
        BaseFab<double>::nBytes(local_48);
        std::istream::read((char *)piVar5,(long)out);
      }
      else {
        BaseFab<double>::box(local_48);
        LVar6 = Box::numPts((Box *)in_stack_fffffffffffffee0);
        iVar2 = BaseFab<double>::nComp(local_48);
        RealDescriptor::convertToNativeFormat
                  (out,LVar6 * iVar2,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      }
    }
    else {
      BaseFab<double>::box(local_48);
      LVar6 = Box::numPts((Box *)in_stack_fffffffffffffee0);
      iVar2 = RealDescriptor::numBytes((RealDescriptor *)0x121ae31);
      is = (istream *)(LVar6 * iVar2);
      std::istream::seekg((long)piVar5,(int)is * local_24);
      pRVar7 = (RealDescriptor *)(local_20 + 0x3e);
      in_stack_fffffffffffffee0 = (BoxArray *)FPC::NativeRealDescriptor();
      bVar1 = RealDescriptor::operator==((RealDescriptor *)in_stack_fffffffffffffee0,pRVar7);
      forceClose = (undefined1)((ulong)pRVar7 >> 0x38);
      if (bVar1) {
        std::istream::read((char *)piVar5,(long)out);
      }
      else {
        BaseFab<double>::box(local_48);
        pRVar7 = (RealDescriptor *)Box::numPts((Box *)in_stack_fffffffffffffee0);
        RealDescriptor::convertToNativeFormat(out,in_stack_ffffffffffffff70,is,pRVar7);
      }
    }
  }
  CloseStream((string *)in_stack_fffffffffffffee0,(bool)forceClose);
  std::__cxx11::string::~string((string *)&local_78);
  return (FArrayBox *)local_48;
}

Assistant:

FArrayBox*
VisMF::readFAB (int                  idx,
                const std::string   &mf_name,
                const VisMF::Header &hdr,
                int                  whichComp)
{
//    BL_PROFILE("VisMF::readFAB_idx");
    Box fab_box(hdr.m_ba[idx]);
    if(hdr.m_ngrow.max() > 0) {
        fab_box.grow(hdr.m_ngrow);
    }

    FArrayBox *fab = new FArrayBox(fab_box, whichComp == -1 ? hdr.m_ncomp : 1);

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(hdr.m_vers == Header::Version_v1) {
      if(whichComp == -1) {    // ---- read all components
        fab->readFrom(*infs);
      } else {
        fab->readFrom(*infs, whichComp);
      }
    } else {
      Real* fabdata = fab->dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab->arena()->isManaged() || fab->arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab->box(), fab->nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(whichComp == -1) {    // ---- read all components
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, fab->nBytes());
        } else {
          Long readDataItems(fab->box().numPts() * fab->nComp());
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }

      } else {
        Long bytesPerComp(fab->box().numPts() * hdr.m_writtenRD.numBytes());
        infs->seekg(bytesPerComp * whichComp, std::ios::cur);
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, bytesPerComp);
        } else {
          Long readDataItems(fab->box().numPts());  // ---- one component only
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab->dataPtr(), hostfab->dataPtr(), fab->size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    }

    VisMF::CloseStream(FullName);

    return fab;
}